

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse_new.cpp
# Opt level: O3

void __thiscall matrix_sparse_row_test_at_Test::TestBody(matrix_sparse_row_test_at_Test *this)

{
  pointer piVar1;
  AssertHelper AVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  const_reference_value pdVar6;
  char *pcVar7;
  long lVar8;
  StringLike<const_char_*> *regex;
  StringLike<const_char_*> *regex_00;
  StringLike<const_char_*> *regex_01;
  AssertHelper AVar9;
  DeathTest *gtest_dt;
  AssertionResult gtest_ar;
  Matrix_Sparse_Row<double,_int> row;
  AssertHelper local_d0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c8;
  Message local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8 [3];
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_a0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_88;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_70;
  Matrix_Sparse_Row<double,_int> local_58;
  
  local_58.ptr_data = &(this->super_matrix_sparse_row_test).csr_data;
  piVar1 = (this->super_matrix_sparse_row_test).csr_data.row_offset.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  local_58.iter_row_offset._M_current = piVar1 + 2;
  lVar8 = (long)piVar1[2];
  local_58.i_column._M_ptr =
       (this->super_matrix_sparse_row_test).csr_data.i_column.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start +
       lVar8;
  local_58.i_column._M_extent._M_extent_value = piVar1[3] - lVar8;
  local_58.value._M_ptr =
       (this->super_matrix_sparse_row_test).csr_data.value.
       super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       + lVar8;
  local_c8._M_head_impl._0_4_ = 1;
  local_58.value._M_extent._M_extent_value = local_58.i_column._M_extent._M_extent_value;
  pdVar6 = Disa::Matrix_Sparse_Row<double,_int>::at(&local_58,(index_type *)&local_c8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&local_c0,"row.at(1)","3.0",*pdVar6,3.0);
  if (local_c0.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_b8[0]->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0xfa,pcVar7);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_b8,local_b8[0]);
  }
  local_c8._M_head_impl._0_4_ = 3;
  pdVar6 = Disa::Matrix_Sparse_Row<double,_int>::at(&local_58,(index_type *)&local_c8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&local_c0,"row.at(3)","4.0",*pdVar6,4.0);
  if (local_c0.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_b8[0]->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0xfb,pcVar7);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_b8,local_b8[0]);
  }
  local_c8._M_head_impl._0_4_ = 4;
  pdVar6 = Disa::Matrix_Sparse_Row<double,_int>::at(&local_58,(index_type *)&local_c8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&local_c0,"row.at(4)","5.0",*pdVar6,5.0);
  if (local_c0.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_b8[0]->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0xfc,pcVar7);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_b8,local_b8[0]);
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_c8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x147446;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_c0,
               (testing *)&local_c8,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_70,(PolymorphicMatcher *)&local_c0);
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8[0]);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("remove_warning = row.at(0)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_70,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
                       ,0xff,(DeathTest **)&local_d0);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_70);
    AVar9.data_ = local_d0.data_;
    if (!bVar3) goto LAB_0010f74f;
    if (local_d0.data_ != (AssertHelperData *)0x0) {
      iVar5 = (**(code **)(*(long *)local_d0.data_ + 0x10))(local_d0.data_);
      AVar2.data_ = local_d0.data_;
      if (iVar5 == 0) {
        iVar5 = (**(code **)(*(long *)local_d0.data_ + 0x18))(local_d0.data_);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
        cVar4 = (**(code **)(*(long *)AVar2.data_ + 0x20))(AVar2.data_,bVar3);
        if (cVar4 == '\0') {
          (**(code **)(*(long *)AVar9.data_ + 8))(AVar9.data_);
          goto LAB_0010f74f;
        }
      }
      else if (iVar5 == 1) {
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          local_c0.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_4_ = 0;
          Disa::Matrix_Sparse_Row<double,_int>::at(&local_58,(index_type *)&local_c0);
        }
        (**(code **)(*(long *)local_d0.data_ + 0x28))(local_d0.data_,2);
        (**(code **)(*(long *)AVar2.data_ + 0x28))(AVar2.data_,0);
      }
      lVar8 = *(long *)AVar9.data_;
      goto LAB_0010f7a2;
    }
  }
  else {
LAB_0010f74f:
    testing::Message::Message(&local_c0);
    pcVar7 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0xff,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    AVar9.data_ = (AssertHelperData *)
                  CONCAT44(local_c0.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           local_c0.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_4_);
    if (AVar9.data_ != (AssertHelperData *)0x0) {
      lVar8 = *(long *)AVar9.data_;
LAB_0010f7a2:
      (**(code **)(lVar8 + 8))(AVar9.data_);
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_c8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x147446;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_c0,
               (testing *)&local_c8,regex_00);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_88,(PolymorphicMatcher *)&local_c0);
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8[0]);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("remove_warning = row.at(2)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_88,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
                       ,0x100,(DeathTest **)&local_d0);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_88);
    AVar9.data_ = local_d0.data_;
    if (!bVar3) goto LAB_0010f8b9;
    if (local_d0.data_ != (AssertHelperData *)0x0) {
      iVar5 = (**(code **)(*(long *)local_d0.data_ + 0x10))(local_d0.data_);
      AVar2.data_ = local_d0.data_;
      if (iVar5 == 0) {
        iVar5 = (**(code **)(*(long *)local_d0.data_ + 0x18))(local_d0.data_);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
        cVar4 = (**(code **)(*(long *)AVar2.data_ + 0x20))(AVar2.data_,bVar3);
        if (cVar4 == '\0') {
          (**(code **)(*(long *)AVar9.data_ + 8))(AVar9.data_);
          goto LAB_0010f8b9;
        }
      }
      else if (iVar5 == 1) {
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          local_c0.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_4_ = 2;
          Disa::Matrix_Sparse_Row<double,_int>::at(&local_58,(index_type *)&local_c0);
        }
        (**(code **)(*(long *)local_d0.data_ + 0x28))(local_d0.data_,2);
        (**(code **)(*(long *)AVar2.data_ + 0x28))(AVar2.data_,0);
      }
      lVar8 = *(long *)AVar9.data_;
      goto LAB_0010f90c;
    }
  }
  else {
LAB_0010f8b9:
    testing::Message::Message(&local_c0);
    pcVar7 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x100,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    AVar9.data_ = (AssertHelperData *)
                  CONCAT44(local_c0.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           local_c0.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_4_);
    if (AVar9.data_ != (AssertHelperData *)0x0) {
      lVar8 = *(long *)AVar9.data_;
LAB_0010f90c:
      (**(code **)(lVar8 + 8))(AVar9.data_);
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_c8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x147446;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_c0,
               (testing *)&local_c8,regex_01);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_a0,(PolymorphicMatcher *)&local_c0);
    if (local_b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8[0]);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("remove_warning = row.at(5)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_a0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
                       ,0x101,(DeathTest **)&local_d0);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_a0);
    AVar9.data_ = local_d0.data_;
    if (bVar3) {
      if (local_d0.data_ == (AssertHelperData *)0x0) {
        return;
      }
      iVar5 = (**(code **)(*(long *)local_d0.data_ + 0x10))(local_d0.data_);
      AVar2.data_ = local_d0.data_;
      if (iVar5 == 0) {
        iVar5 = (**(code **)(*(long *)local_d0.data_ + 0x18))(local_d0.data_);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
        cVar4 = (**(code **)(*(long *)local_d0.data_ + 0x20))(local_d0.data_,bVar3);
        if (cVar4 == '\0') {
          (**(code **)(*(long *)AVar9.data_ + 8))(AVar9.data_);
          goto LAB_0010fa23;
        }
      }
      else if (iVar5 == 1) {
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          local_c0.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_4_ = 5;
          Disa::Matrix_Sparse_Row<double,_int>::at(&local_58,(index_type *)&local_c0);
        }
        (**(code **)(*(long *)local_d0.data_ + 0x28))(local_d0.data_,2);
        (**(code **)(*(long *)AVar2.data_ + 0x28))(AVar2.data_,0);
      }
      lVar8 = *(long *)AVar9.data_;
      goto LAB_0010fa76;
    }
  }
LAB_0010fa23:
  testing::Message::Message(&local_c0);
  pcVar7 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_c8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
             ,0x101,pcVar7);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,&local_c0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
  AVar9.data_ = (AssertHelperData *)
                CONCAT44(local_c0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_c0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_);
  if (AVar9.data_ == (AssertHelperData *)0x0) {
    return;
  }
  lVar8 = *(long *)AVar9.data_;
LAB_0010fa76:
  (**(code **)(lVar8 + 8))(AVar9.data_);
  return;
}

Assistant:

TEST_F(matrix_sparse_row_test, at) {
  Matrix_Sparse_Row<double, int> row(&csr_data, csr_data.row_offset.begin() + 2);

  EXPECT_DOUBLE_EQ(row.at(1), 3.0);
  EXPECT_DOUBLE_EQ(row.at(3), 4.0);
  EXPECT_DOUBLE_EQ(row.at(4), 5.0);

  double remove_warning = 0;
  EXPECT_DEATH(remove_warning = row.at(0), "./*");
  EXPECT_DEATH(remove_warning = row.at(2), "./*");
  EXPECT_DEATH(remove_warning = row.at(5), "./*");
}